

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  
  if ((short)ctx->pMem->flags < 0) {
    pcVar6 = ctx->pMem->z;
  }
  else {
    pcVar6 = (char *)createAggContext(ctx,0);
  }
  if (pcVar6 != (char *)0x0) {
    uVar2 = *(ulong *)(pcVar6 + 0x18);
    if (1 < uVar2) {
      lVar3 = *(long *)(pcVar6 + 8);
      bVar4 = false;
      uVar8 = 1;
      iVar5 = 0;
      do {
        bVar1 = *(byte *)(lVar3 + uVar8);
        iVar7 = (int)uVar8;
        if (((bVar1 == 0x2c) && (!bVar4)) && (iVar5 == 0)) {
          *(ulong *)(pcVar6 + 0x18) = uVar2 - uVar8;
          memmove((void *)(lVar3 + 1),(void *)((ulong)(iVar7 + 1) + lVar3),(uVar2 - uVar8) - 1);
          *(undefined1 *)(lVar3 + *(long *)(pcVar6 + 0x18)) = 0;
          return;
        }
        if (bVar1 == 0x5c) {
          iVar7 = iVar7 + 1;
        }
        else if (bVar1 == 0x22) {
          bVar4 = !bVar4;
        }
        else if (bVar4) {
          bVar4 = true;
        }
        else {
          iVar5 = (iVar5 + (uint)((bVar1 & 0xdf) == 0x5b)) - (uint)((bVar1 & 0xdf) == 0x5d);
          bVar4 = false;
        }
        uVar8 = (ulong)(iVar7 + 1);
      } while (uVar8 < uVar2);
    }
    pcVar6[0x18] = '\x01';
    pcVar6[0x19] = '\0';
    pcVar6[0x1a] = '\0';
    pcVar6[0x1b] = '\0';
    pcVar6[0x1c] = '\0';
    pcVar6[0x1d] = '\0';
    pcVar6[0x1e] = '\0';
    pcVar6[0x1f] = '\0';
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  unsigned int i;
  int inStr = 0;
  int nNest = 0;
  char *z;
  char c;
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initalize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; i<pStr->nUsed && ((c = z[i])!=',' || inStr || nNest); i++){
    if( c=='"' ){
      inStr = !inStr;
    }else if( c=='\\' ){
      i++;
    }else if( !inStr ){
      if( c=='{' || c=='[' ) nNest++;
      if( c=='}' || c==']' ) nNest--;
    }
  }
  if( i<pStr->nUsed ){
    pStr->nUsed -= i;
    memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
    z[pStr->nUsed] = 0;
  }else{
    pStr->nUsed = 1;
  }
}